

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

void __thiscall wasm::ReReloop::ReReloop(ReReloop *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ReReloop_00e20c48;
  p_Var1 = &(this->breakTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->relooper)._M_t.super___uniq_ptr_impl<CFG::Relooper,_std::default_delete<CFG::Relooper>_>.
  _M_t.super__Tuple_impl<0UL,_CFG::Relooper_*,_std::default_delete<CFG::Relooper>_>.
  super__Head_base<0UL,_CFG::Relooper_*,_false>._M_head_impl = (Relooper *)0x0;
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  this->currCFGBlock = (Block *)0x0;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack).
  super__Vector_base<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).
  super__Vector_base<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }